

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_stream.hpp
# Opt level: O2

bool __thiscall
cfgfile::input_stream_t<cfgfile::string_trait_t>::is_new_line
          (input_stream_t<cfgfile::string_trait_t> *this,char_t *ch)

{
  bool bVar1;
  char_t local_19;
  
  bVar1 = true;
  if (*ch != const_t<cfgfile::string_trait_t>::c_carriage_return) {
    if (*ch == const_t<cfgfile::string_trait_t>::c_line_feed) {
      local_19 = simple_get(this);
      if (local_19 == const_t<cfgfile::string_trait_t>::c_carriage_return) {
        *ch = local_19;
      }
      else {
        std::deque<char,_std::allocator<char>_>::push_back(&(this->m_returned_char).c,&local_19);
      }
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool is_new_line( typename Trait::char_t & ch )
	{
		if( ch == const_t< Trait >::c_carriage_return )
			return true;
		else if( ch == const_t< Trait >::c_line_feed )
		{
			typename Trait::char_t next_char( 0x00 );

			next_char = simple_get();

			if( next_char == const_t< Trait >::c_carriage_return )
			{
				ch = next_char;

				return true;
			}
			else
			{
				m_returned_char.push( next_char );

				return true;
			}
		}
		else
			return false;
	}